

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O3

void __thiscall
ctemplate::PreEscape::Modify
          (PreEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  byte bVar1;
  long lVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  
  if ((long)inlen < 1) {
    return;
  }
  pcVar7 = in + inlen;
LAB_0012a974:
  lVar6 = 0;
  do {
    bVar1 = in[lVar6];
    if (bVar1 < 0x27) {
      if (bVar1 == 0x22) {
        if (in < in + lVar6) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar6);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 6;
        pcVar5 = "&quot;";
        goto LAB_0012aa8d;
      }
      if (bVar1 == 0x26) {
        if (in < in + lVar6) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar6);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 5;
        pcVar5 = "&amp;";
        goto LAB_0012aa8d;
      }
    }
    else {
      if (bVar1 == 0x27) {
        if (in < in + lVar6) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar6);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 5;
        pcVar5 = "&#39;";
        goto LAB_0012aa8d;
      }
      if (bVar1 == 0x3c) {
        if (in < in + lVar6) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar6);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 4;
        pcVar5 = "&lt;";
        goto LAB_0012aa8d;
      }
      if (bVar1 == 0x3e) break;
    }
    lVar2 = lVar6 + 1;
    lVar6 = lVar6 + 1;
    if (pcVar7 <= in + lVar2) {
      if (in + lVar6 <= in) {
        return;
      }
      (*out->_vptr_ExpandEmitter[5])(out,in,lVar6);
      return;
    }
  } while( true );
  if (in < in + lVar6) {
    (*out->_vptr_ExpandEmitter[5])(out,in,lVar6);
  }
  pp_Var3 = out->_vptr_ExpandEmitter;
  uVar4 = 4;
  pcVar5 = "&gt;";
LAB_0012aa8d:
  (*pp_Var3[5])(out,pcVar5,uVar4);
  in = in + lVar6 + 1;
  if (pcVar7 <= in) {
    return;
  }
  goto LAB_0012a974;
}

Assistant:

void PreEscape::Modify(const char* in, size_t inlen,
                       const PerExpandData*,
                       ExpandEmitter* out, const string& arg) const {
  const char* pos = in;
  const char* start = pos;
  const char* const limit = in + inlen;
  while (pos < limit)  {
    switch (*pos) {
      default:
        // Increment our counter and look at the next character.
        ++pos;
        continue;

      // Unlike HtmlEscape, we leave whitespace as is.
      case '&':  EmitRun(start, pos, out); APPEND("&amp;");  break;
      case '"':  EmitRun(start, pos, out); APPEND("&quot;"); break;
      case '\'': EmitRun(start, pos, out); APPEND("&#39;");  break;
      case '<':  EmitRun(start, pos, out); APPEND("&lt;");   break;
      case '>':  EmitRun(start, pos, out); APPEND("&gt;");   break;
    }
    start = ++pos;
  }
  EmitRun(start, pos, out);
}